

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bool slang::caseZWildcardEqual(SVInt *lhs,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  SVInt *pSVar3;
  SVInt *pSVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  SVInt SStack_48;
  
  bVar7 = (lhs->super_SVIntStorage).unknownFlag;
  if ((bVar7 == false) && ((rhs->super_SVIntStorage).unknownFlag == false)) {
    bVar7 = exactlyEqual(lhs,rhs);
    return bVar7;
  }
  uVar2 = (lhs->super_SVIntStorage).bitWidth;
  uVar8 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar2 == uVar8) {
    uVar8 = uVar2 + 0x3f >> 6;
    pSVar3 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
    bVar1 = (rhs->super_SVIntStorage).unknownFlag;
    if (bVar7 != false) {
      lhs = pSVar3;
    }
    pSVar4 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
    if ((bVar1 & 1U) != 0) {
      rhs = pSVar4;
    }
    if (0x40 < uVar2) {
      rhs = pSVar4;
      lhs = pSVar3;
    }
    uVar9 = (ulong)(uVar8 << 3);
    uVar10 = 0;
    while (bVar14 = uVar8 == uVar10, !bVar14) {
      if (bVar7 == false) {
        uVar13 = 0xffffffffffffffff;
        uVar11 = 0;
      }
      else {
        uVar13 = *(ulong *)((long)&(pSVar3->super_SVIntStorage).field_0 + uVar10 * 8 + uVar9);
        uVar12 = (&(pSVar3->super_SVIntStorage).field_0)[uVar10].val;
        uVar11 = ~uVar12 & uVar13;
        uVar13 = ~(uVar12 & uVar13);
      }
      if ((bVar1 & 1U) == 0) {
        uVar12 = 0;
      }
      else {
        uVar5 = *(ulong *)((long)&(pSVar4->super_SVIntStorage).field_0 + uVar10 * 8 + uVar9);
        uVar6 = (&(pSVar4->super_SVIntStorage).field_0)[uVar10].val;
        uVar12 = ~uVar6 & uVar5;
        uVar13 = uVar13 & ~(uVar6 & uVar5);
      }
      if ((((&(rhs->super_SVIntStorage).field_0)[uVar10].val ^
           (&(lhs->super_SVIntStorage).field_0)[uVar10].val) & uVar13) != 0) {
        return bVar14;
      }
      uVar10 = uVar10 + 1;
      if (((uVar12 ^ uVar11) & uVar13) != 0) {
        return bVar14;
      }
    }
  }
  else {
    if (uVar2 < uVar8) {
      SVInt::extend(&SStack_48,(bitwidth_t)lhs,SUB41(uVar8,0));
      bVar14 = caseZWildcardEqual(&SStack_48,rhs);
    }
    else {
      SVInt::extend(&SStack_48,(bitwidth_t)rhs,SUB41(uVar2,0));
      bVar14 = caseZWildcardEqual(lhs,&SStack_48);
    }
    SVInt::~SVInt(&SStack_48);
  }
  return bVar14;
}

Assistant:

bool caseZWildcardEqual(const SVInt& lhs, const SVInt& rhs) {
    // if no unknown flags, do normal comparison
    if (!lhs.unknownFlag && !rhs.unknownFlag)
        return exactlyEqual(lhs, rhs);

    // handle sign extension if necessary
    if (lhs.bitWidth != rhs.bitWidth) {
        bool bothSigned = lhs.signFlag && rhs.signFlag;
        if (lhs.bitWidth < rhs.bitWidth)
            return caseZWildcardEqual(lhs.extend(rhs.bitWidth, bothSigned), rhs);
        else
            return caseZWildcardEqual(lhs, rhs.extend(lhs.bitWidth, bothSigned));
    }

    uint32_t words = SVInt::getNumWords(rhs.bitWidth, false);
    for (uint32_t i = 0; i < words; ++i) {
        // bitmask to avoid comparing the Z bits on either side
        uint64_t mask = UINT64_MAX;

        uint64_t lunknown = 0;
        if (lhs.unknownFlag) {
            lunknown = lhs.pVal[i + words] & ~lhs.pVal[i];
            mask &= ~(lhs.pVal[i + words] & lhs.pVal[i]);
        }

        uint64_t runknown = 0;
        if (rhs.unknownFlag) {
            runknown = rhs.pVal[i + words] & ~rhs.pVal[i];
            mask &= ~(rhs.pVal[i + words] & rhs.pVal[i]);
        }

        if ((lhs.getRawData()[i] & mask) != (rhs.getRawData()[i] & mask) ||
            (lunknown & mask) != (runknown & mask)) {
            return false;
        }
    }

    return true;
}